

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QLayoutItem * __thiscall QDockAreaLayout::takeAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  ulong uVar2;
  QLayoutItem *pQVar3;
  QLayoutItem *pQVar4;
  ulong uVar5;
  QLayoutItem *ret;
  QDockAreaLayoutInfo *this_00;
  bool bVar6;
  
  pQVar3 = QDockAreaLayoutInfo::takeAt(this->docks,x,index);
  if (pQVar3 == (QLayoutItem *)0x0) {
    this_00 = this->docks;
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      this_00 = this_00 + 1;
      pQVar4 = pQVar3;
      if (uVar5 == 3) break;
      pQVar4 = QDockAreaLayoutInfo::takeAt(this_00,x,index);
      uVar2 = uVar5 + 1;
    } while (pQVar4 == (QLayoutItem *)0x0);
    bVar6 = 2 < uVar5;
  }
  else {
    bVar6 = false;
    pQVar4 = pQVar3;
  }
  if (bVar6) {
    pQVar4 = this->centralWidgetItem;
    if ((pQVar4 == (QLayoutItem *)0x0) || (iVar1 = *x, *x = iVar1 + 1, iVar1 != index)) {
      pQVar4 = (QLayoutItem *)0x0;
    }
    else {
      this->centralWidgetItem = (QLayoutItem *)0x0;
    }
  }
  return pQVar4;
}

Assistant:

QLayoutItem *QDockAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.takeAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index) {
        QLayoutItem *ret = centralWidgetItem;
        centralWidgetItem = nullptr;
        return ret;
    }

    return nullptr;
}